

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_peak2_reinit(ma_peak2_config *pConfig,ma_peak2 *pFilter)

{
  long in_RSI;
  undefined4 *in_RDI;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double A;
  double a;
  double c;
  double s;
  double w;
  double q;
  ma_biquad_config *in_stack_ffffffffffffff08;
  undefined4 local_f0;
  undefined4 local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [84];
  ma_result local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined4 *local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if ((in_RSI == 0) || (in_RDI == (undefined4 *)0x0)) {
    local_64 = MA_INVALID_ARGS;
  }
  else {
    local_38 = *(double *)(in_RDI + 6);
    local_40 = (*(double *)(in_RDI + 8) * 6.283185307179586) / (double)(uint)in_RDI[2];
    local_30 = in_RDI;
    local_18 = local_40;
    local_48 = sin(local_40);
    local_10 = local_40;
    local_8 = 1.5707963267948966 - local_40;
    local_50 = sin(local_8);
    local_58 = local_48 / (local_38 * 2.0);
    local_28 = *(double *)(local_30 + 4) / 40.0;
    local_20 = 0x4024000000000000;
    local_60 = pow(10.0,local_28);
    local_e8 = local_58 * local_60 + 1.0;
    local_e0 = local_50 * -2.0;
    local_d8 = -local_58 * local_60 + 1.0;
    local_d0 = local_58 / local_60 + 1.0;
    local_c8 = local_50 * -2.0;
    local_c0 = 1.0 - local_58 / local_60;
    local_f0 = *local_30;
    local_ec = local_30[1];
    memcpy(local_b8,&local_f0,0x38);
    local_64 = ma_biquad_reinit(in_stack_ffffffffffffff08,(ma_biquad *)0x21b117);
    if (local_64 == MA_SUCCESS) {
      local_64 = MA_SUCCESS;
    }
  }
  return local_64;
}

Assistant:

MA_API ma_result ma_peak2_reinit(const ma_peak2_config* pConfig, ma_peak2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_peak2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}